

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_Pain(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                    VMReturn *ret,int numret)

{
  AActor *ent;
  player_t *ppVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  FSoundID *sound_id;
  char *pcVar5;
  bool bVar6;
  FString pain_sound;
  FString local_30;
  FSoundID local_28;
  FSoundID local_24;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      ent = (AActor *)(param->field_0).field_1.a;
      if (ent != (AActor *)0x0) {
        if ((ent->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          (ent->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (ent->super_DThinker).super_DObject.Class;
        bVar6 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar6) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar6 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar6) {
          pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f539f;
        }
      }
      ppVar1 = ent->player;
      if ((ppVar1 == (player_t *)0x0) || (ppVar1->morphTics != 0)) {
        local_28.ID = (ent->PainSound).super_FSoundID.ID;
        if (local_28.ID == 0) {
          return 0;
        }
        sound_id = &local_28;
      }
      else {
        iVar3 = ent->health;
        if (iVar3 < 0x19) {
          pcVar5 = "*pain25";
        }
        else if (iVar3 < 0x32) {
          pcVar5 = "*pain50";
        }
        else {
          pcVar5 = "*pain100";
          if (iVar3 < 0x4b) {
            pcVar5 = "*pain75";
          }
        }
        if ((ppVar1->LastDamageType).Index == 0) {
          iVar3 = 0;
        }
        else {
          FString::FString(&local_30,pcVar5);
          FString::operator+=(&local_30,'-');
          FString::operator+=(&local_30,
                              FName::NameData.NameArray[(ent->player->LastDamageType).Index].Text);
          iVar3 = S_FindSound(local_30.Chars);
          if (iVar3 == 0) {
            FString::operator=(&local_30,"*pain-");
            FString::operator+=(&local_30,
                                FName::NameData.NameArray[(ent->player->LastDamageType).Index].Text)
            ;
            iVar3 = S_FindSound(local_30.Chars);
          }
          FString::~FString(&local_30);
        }
        if (iVar3 == 0) {
          iVar3 = S_FindSound(pcVar5);
        }
        sound_id = &local_24;
        local_24.ID = iVar3;
      }
      S_Sound(ent,2,sound_id,1.0,1.0);
      return 0;
    }
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f539f:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0xd1d,"int AF_AActor_A_Pain(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Pain)
{
	PARAM_SELF_PROLOGUE(AActor);

	// [RH] Vary player pain sounds depending on health (ala Quake2)
	if (self->player && self->player->morphTics == 0)
	{
		const char *pain_amount;
		FSoundID sfx_id;

		if (self->health < 25)
			pain_amount = "*pain25";
		else if (self->health < 50)
			pain_amount = "*pain50";
		else if (self->health < 75)
			pain_amount = "*pain75";
		else
			pain_amount = "*pain100";

		// Try for damage-specific sounds first.
		if (self->player->LastDamageType != NAME_None)
		{
			FString pain_sound = pain_amount;
			pain_sound += '-';
			pain_sound += self->player->LastDamageType;
			sfx_id = pain_sound;
			if (sfx_id == 0)
			{
				// Try again without a specific pain amount.
				pain_sound = "*pain-";
				pain_sound += self->player->LastDamageType;
				sfx_id = pain_sound;
			}
		}
		if (sfx_id == 0)
		{
			sfx_id = pain_amount;
		}

		S_Sound (self, CHAN_VOICE, sfx_id, 1, ATTN_NORM);
	}
	else if (self->PainSound)
	{
		S_Sound (self, CHAN_VOICE, self->PainSound, 1, ATTN_NORM);
	}
	return 0;
}